

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O2

int32_t icu_63::PluralFormat::findSubMessage
                  (MessagePattern *pattern,int32_t partIndex,PluralSelector *selector,void *context,
                  double number,UErrorCode *ec)

{
  int iVar1;
  UBool UVar2;
  int8_t iVar3;
  long lVar4;
  int iVar5;
  Part *pPVar6;
  bool bVar7;
  double dVar8;
  int local_13c;
  double local_138;
  ConstChar16Ptr local_120;
  PluralSelector *local_118;
  void *local_110;
  UErrorCode *local_108;
  char16_t *local_100;
  UnicodeString keyword;
  UnicodeString other;
  UnicodeString local_70;
  
  local_13c = 0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = pattern->partsLength;
    local_110 = context;
    local_108 = ec;
    if ((pattern->parts[partIndex].type & ~UMSGPAT_PART_TYPE_MSG_LIMIT) == UMSGPAT_PART_TYPE_ARG_INT
       ) {
      local_138 = MessagePattern::getNumericValue(pattern,pattern->parts + partIndex);
      partIndex = partIndex + 1;
    }
    else {
      local_138 = 0.0;
    }
    keyword.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
    keyword.fUnion.fStackFields.fLengthAndFlags = 2;
    local_120.p_ = (char16_t *)OTHER_STRING;
    local_13c = 0;
    local_118 = selector;
    icu_63::UnicodeString::UnicodeString(&other,'\0',&local_120,5);
    local_100 = local_120.p_;
    pPVar6 = pattern->parts;
    bVar7 = false;
    do {
      iVar5 = local_13c;
      if (pPVar6[partIndex].type == UMSGPAT_PART_TYPE_ARG_LIMIT) break;
      iVar5 = partIndex + 1;
      lVar4 = (long)iVar5;
      if ((pPVar6[lVar4].type & ~UMSGPAT_PART_TYPE_MSG_LIMIT) == UMSGPAT_PART_TYPE_ARG_INT) {
        dVar8 = MessagePattern::getNumericValue(pattern,pPVar6 + lVar4);
        iVar5 = partIndex + 2;
        if ((dVar8 == number) && (!NAN(dVar8) && !NAN(number))) break;
        lVar4 = (long)iVar5;
      }
      else if (bVar7) {
LAB_002a98bb:
        bVar7 = true;
      }
      else {
        UVar2 = MessagePattern::partSubstringMatches(pattern,pPVar6 + partIndex,&other);
        if (UVar2 == '\0') {
          if ((ushort)keyword.fUnion.fStackFields.fLengthAndFlags < 0x20) {
            (*local_118->_vptr_PluralSelector[2])
                      (number - local_138,&local_70,local_118,local_110,local_108);
            icu_63::UnicodeString::moveFrom(&keyword,&local_70);
            icu_63::UnicodeString::~UnicodeString(&local_70);
            if ((local_13c != 0) &&
               (iVar3 = icu_63::UnicodeString::compare(&keyword,&other), iVar3 == '\0'))
            goto LAB_002a98bb;
          }
          UVar2 = MessagePattern::partSubstringMatches(pattern,pPVar6 + partIndex,&keyword);
          bVar7 = UVar2 != '\0';
          if (bVar7) {
            local_13c = iVar5;
          }
        }
        else if (local_13c == 0) {
          iVar3 = icu_63::UnicodeString::compare(&keyword,&other);
          bVar7 = iVar3 == '\0';
          local_13c = iVar5;
        }
        else {
          bVar7 = false;
        }
      }
      pPVar6 = pattern->parts;
      if (iVar5 < pPVar6[lVar4].limitPartIndex) {
        iVar5 = pPVar6[lVar4].limitPartIndex;
      }
      partIndex = iVar5 + 1;
      iVar5 = local_13c;
    } while (partIndex < iVar1);
    local_13c = iVar5;
    icu_63::UnicodeString::~UnicodeString(&other);
    icu_63::UnicodeString::~UnicodeString(&keyword);
  }
  return local_13c;
}

Assistant:

int32_t PluralFormat::findSubMessage(const MessagePattern& pattern, int32_t partIndex,
                                     const PluralSelector& selector, void *context,
                                     double number, UErrorCode& ec) {
    if (U_FAILURE(ec)) {
        return 0;
    }
    int32_t count=pattern.countParts();
    double offset;
    const MessagePattern::Part* part=&pattern.getPart(partIndex);
    if (MessagePattern::Part::hasNumericValue(part->getType())) {
        offset=pattern.getNumericValue(*part);
        ++partIndex;
    } else {
        offset=0;
    }
    // The keyword is empty until we need to match against a non-explicit, not-"other" value.
    // Then we get the keyword from the selector.
    // (In other words, we never call the selector if we match against an explicit value,
    // or if the only non-explicit keyword is "other".)
    UnicodeString keyword;
    UnicodeString other(FALSE, OTHER_STRING, 5);
    // When we find a match, we set msgStart>0 and also set this boolean to true
    // to avoid matching the keyword again (duplicates are allowed)
    // while we continue to look for an explicit-value match.
    UBool haveKeywordMatch=FALSE;
    // msgStart is 0 until we find any appropriate sub-message.
    // We remember the first "other" sub-message if we have not seen any
    // appropriate sub-message before.
    // We remember the first matching-keyword sub-message if we have not seen
    // one of those before.
    // (The parser allows [does not check for] duplicate keywords.
    // We just have to make sure to take the first one.)
    // We avoid matching the keyword twice by also setting haveKeywordMatch=true
    // at the first keyword match.
    // We keep going until we find an explicit-value match or reach the end of the plural style.
    int32_t msgStart=0;
    // Iterate over (ARG_SELECTOR [ARG_INT|ARG_DOUBLE] message) tuples
    // until ARG_LIMIT or end of plural-only pattern.
    do {
        part=&pattern.getPart(partIndex++);
        const UMessagePatternPartType type = part->getType();
        if(type==UMSGPAT_PART_TYPE_ARG_LIMIT) {
            break;
        }
        U_ASSERT (type==UMSGPAT_PART_TYPE_ARG_SELECTOR);
        // part is an ARG_SELECTOR followed by an optional explicit value, and then a message
        if(MessagePattern::Part::hasNumericValue(pattern.getPartType(partIndex))) {
            // explicit value like "=2"
            part=&pattern.getPart(partIndex++);
            if(number==pattern.getNumericValue(*part)) {
                // matches explicit value
                return partIndex;
            }
        } else if(!haveKeywordMatch) {
            // plural keyword like "few" or "other"
            // Compare "other" first and call the selector if this is not "other".
            if(pattern.partSubstringMatches(*part, other)) {
                if(msgStart==0) {
                    msgStart=partIndex;
                    if(0 == keyword.compare(other)) {
                        // This is the first "other" sub-message,
                        // and the selected keyword is also "other".
                        // Do not match "other" again.
                        haveKeywordMatch=TRUE;
                    }
                }
            } else {
                if(keyword.isEmpty()) {
                    keyword=selector.select(context, number-offset, ec);
                    if(msgStart!=0 && (0 == keyword.compare(other))) {
                        // We have already seen an "other" sub-message.
                        // Do not match "other" again.
                        haveKeywordMatch=TRUE;
                        // Skip keyword matching but do getLimitPartIndex().
                    }
                }
                if(!haveKeywordMatch && pattern.partSubstringMatches(*part, keyword)) {
                    // keyword matches
                    msgStart=partIndex;
                    // Do not match this keyword again.
                    haveKeywordMatch=TRUE;
                }
            }
        }
        partIndex=pattern.getLimitPartIndex(partIndex);
    } while(++partIndex<count);
    return msgStart;
}